

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

int luckyCheck(word *pAfter,word *pBefore,int nVars,char *pCanonPerm,uint uCanonPhase)

{
  word *__s2;
  word *__s1;
  int iVar1;
  int local_3c;
  int iStack_38;
  char tempChar;
  int j;
  int i;
  uint uCanonPhase_local;
  char *pCanonPerm_local;
  word *pwStack_20;
  int nVars_local;
  word *pBefore_local;
  word *pAfter_local;
  
  local_3c = 0;
  j = uCanonPhase;
  _i = pCanonPerm;
  pCanonPerm_local._4_4_ = nVars;
  pwStack_20 = pBefore;
  pBefore_local = pAfter;
  do {
    if (pCanonPerm_local._4_4_ <= local_3c) {
      if (((uint)j >> ((byte)pCanonPerm_local._4_4_ & 0x1f) & 1) != 0) {
        Kit_TruthNot_64bit(pBefore_local,pCanonPerm_local._4_4_);
      }
      __s1 = pBefore_local;
      __s2 = pwStack_20;
      iVar1 = Kit_TruthWordNum_64bit(pCanonPerm_local._4_4_);
      iVar1 = memcmp(__s1,__s2,(long)iVar1 << 3);
      pAfter_local._4_4_ = (uint)(iVar1 != 0);
      return pAfter_local._4_4_;
    }
    for (iStack_38 = local_3c; iStack_38 < pCanonPerm_local._4_4_; iStack_38 = iStack_38 + 1) {
      if ((char)((char)local_3c + 'a') == _i[iStack_38]) {
        swapAndFlip(pBefore_local,pCanonPerm_local._4_4_,local_3c,iStack_38,_i,(uint *)&j);
        break;
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int luckyCheck(word* pAfter, word* pBefore, int nVars, char * pCanonPerm, unsigned uCanonPhase)
{
    int i,j;
    char tempChar;
    for(j=0;j<nVars;j++)
    {
        tempChar = 'a'+ j;
        for(i=j;i<nVars;i++)
        {
            if(tempChar != pCanonPerm[i])
                continue;
            swapAndFlip(pAfter , nVars, j, i, pCanonPerm, &uCanonPhase);
            break;
        }
    }
    if((uCanonPhase>>nVars) & 1)
        Kit_TruthNot_64bit(pAfter, nVars );
    if(memcmp(pAfter, pBefore, Kit_TruthWordNum_64bit( nVars )*sizeof(word)) == 0)
        return 0;
    else
        return 1;
}